

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_view_lookat_rh_EXP(matrix4 *self,vector3 *eye,vector3 *target,vector3 *up)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vector3 xaxis;
  anon_union_12_3_07544b15_for_vector3_0 local_48;
  anon_union_12_3_07544b15_for_vector3_0 local_38;
  
  local_38.v[0] = (float)*(undefined8 *)&target->field_0 - (float)*(undefined8 *)&eye->field_0;
  local_38.v[1] =
       (float)((ulong)*(undefined8 *)&target->field_0 >> 0x20) -
       (float)((ulong)*(undefined8 *)&eye->field_0 >> 0x20);
  local_38.v[2] = (target->field_0).v[2] - (eye->field_0).v[2];
  vector3_normalize((vector3 *)&local_38.field_1);
  vector3_cross_product((vector3 *)&local_48.field_1,(vector3 *)&local_38.field_1,up);
  vector3_normalize((vector3 *)&local_48.field_1);
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[7] = 0.0;
  *(undefined8 *)((long)&self->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x34) = 0;
  (self->field_0).m[0xf] = 1.0;
  *(undefined8 *)&self->field_0 = local_48._0_8_;
  (self->field_0).m[2] = local_48.v[2];
  fVar4 = (float)local_48._0_8_;
  fVar5 = (float)((ulong)local_48._0_8_ >> 0x20);
  fVar1 = fVar5 * local_38.v[2] - local_38.v[1] * local_48.v[2];
  (self->field_0).m[4] = fVar1;
  fVar2 = local_48.v[2] * local_38.v[0] - local_38.v[2] * fVar4;
  fVar3 = fVar4 * local_38.v[1] - local_38.v[0] * fVar5;
  *(ulong *)((long)&self->field_0 + 0x14) = CONCAT44(fVar3,fVar2);
  *(ulong *)((long)&self->field_0 + 0x20) =
       CONCAT44(local_38.v[1],local_38.v[0]) ^ 0x8000000080000000;
  (self->field_0).m[10] = -local_38.v[2];
  (self->field_0).m[3] =
       -(local_48.v[2] * (eye->field_0).v[2] +
        (eye->field_0).v[0] * fVar4 + (eye->field_0).v[1] * fVar5);
  (self->field_0).m[7] =
       -(fVar3 * (eye->field_0).v[2] + fVar1 * (eye->field_0).v[0] + (eye->field_0).v[1] * fVar2);
  (self->field_0).m[0xb] =
       -(local_38.v[2] * (eye->field_0).v[2] +
        local_38.v[0] * (eye->field_0).v[0] + (eye->field_0).v[1] * local_38.v[1]);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_view_lookat_rh_EXP(struct matrix4 *self, const struct vector3 *eye, const struct vector3 *target, const struct vector3 *up)
{
	struct vector3 yaxis;
	struct vector3 zaxis;
	struct vector3 xaxis;

	zaxis.x = target->x - eye->x;
	zaxis.y = target->y - eye->y;
	zaxis.z = target->z - eye->z;
	vector3_normalize(&zaxis);

	/* xaxis = zaxis x up */
	vector3_cross_product(&xaxis, &zaxis, up);
	vector3_normalize(&xaxis);

	/* yaxis = xaxis x zaxis */
	vector3_cross_product(&yaxis, &xaxis, &zaxis);

	matrix4_identity(self);

	self->c00 = xaxis.x;
	self->c10 = xaxis.y;
	self->c20 = xaxis.z;

	self->c01 = yaxis.x;
	self->c11 = yaxis.y;
	self->c21 = yaxis.z;

	self->c02 = -zaxis.x;
	self->c12 = -zaxis.y;
	self->c22 = -zaxis.z;

	self->c30 = -vector3_dot_product(&xaxis, eye);
	self->c31 = -vector3_dot_product(&yaxis, eye);
	self->c32 = -vector3_dot_product(&zaxis, eye);

	return self;
}